

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3.cpp
# Opt level: O2

int __thiscall arbiter::drivers::S3::copy(S3 *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int extraout_EAX;
  mapped_type *this_00;
  allocator local_229;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208 [32];
  key_type local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  string local_148;
  Headers headers;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  _Vector_base<char,_std::allocator<char>_> local_98;
  Resource resource;
  
  headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &headers._M_t._M_impl.super__Rb_tree_header._M_header;
  headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string
            ((string *)&local_148,
             (string *)
             &((this->m_config)._M_t.
               super___uniq_ptr_impl<arbiter::drivers::S3::Config,_std::default_delete<arbiter::drivers::S3::Config>_>
               ._M_t.
               super__Tuple_impl<0UL,_arbiter::drivers::S3::Config_*,_std::default_delete<arbiter::drivers::S3::Config>_>
               .super__Head_base<0UL,_arbiter::drivers::S3::Config_*,_false>._M_head_impl)->
              m_baseUrl);
  ::std::__cxx11::string::string((string *)&local_168,(string *)dst);
  Resource::Resource(&resource,&local_148,&local_168);
  ::std::__cxx11::string::~string((string *)&local_168);
  ::std::__cxx11::string::~string((string *)&local_148);
  ::std::__cxx11::string::string((string *)&local_1a8,(string *)&resource.m_bucket);
  ::std::operator+(&local_188,&local_1a8,'/');
  ::std::__cxx11::string::string((string *)&local_1c8,(string *)&resource.m_object);
  ::std::operator+(&local_228,&local_188,&local_1c8);
  ::std::__cxx11::string::string((string *)&local_1e8,"x-amz-copy-source",&local_229);
  this_00 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&headers,&local_1e8);
  ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_228);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_228);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_188);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::__cxx11::string::string(local_208,(string *)src);
  local_228._M_dataplus._M_p = (pointer)0x0;
  local_228._M_string_length = 0;
  local_228.field_2._M_allocated_capacity = 0;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_c8,&headers._M_t);
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl._0_8_ = 0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  (*(this->super_Http).super_Driver._vptr_Driver[9])
            (&local_98,this,local_208,&local_228,&local_c8,&local_f8);
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_98);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_f8);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c8);
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&local_228);
  ::std::__cxx11::string::~string(local_208);
  Resource::~Resource(&resource);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&headers._M_t);
  return extraout_EAX;
}

Assistant:

void S3::copy(const std::string src, const std::string dst) const
{
    Headers headers;
    const Resource resource(m_config->baseUrl(), src);
    headers["x-amz-copy-source"] = resource.bucket() + '/' + resource.object();
    put(dst, std::vector<char>(), headers, Query());
}